

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int compareFileMem(char *filename,char *mem,int size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  char *__format;
  uint uVar6;
  uint uVar7;
  stat info;
  char bytes [4096];
  stat64 local_10c8;
  char local_1038 [4104];
  
  if (update_results == '\x01') {
    iVar2 = open64(filename,0x241,0x1a4);
    if (-1 < iVar2) {
      sVar4 = write(iVar2,mem,(long)size);
      close(iVar2);
      uVar7 = (uint)sVar4;
LAB_00109350:
      return (uint)(uVar7 != size);
    }
    __format = "failed to open %s for writing";
  }
  else {
    iVar2 = stat64(filename,&local_10c8);
    if (iVar2 < 0) {
      __format = "failed to stat %s\n";
    }
    else {
      if (local_10c8.st_size != size) {
        fprintf(_stderr,"file %s is %ld bytes, result is %d bytes\n",filename,local_10c8.st_size,
                (ulong)(uint)size);
        return -1;
      }
      iVar2 = open64(filename,0);
      if (-1 < iVar2) {
        uVar1 = 0;
        do {
          uVar7 = uVar1;
          if (size <= (int)uVar7) {
LAB_00109339:
            close(iVar2);
            if (uVar7 != size) {
              fprintf(_stderr,"Compare error index %d, size %d\n",(ulong)uVar7,(ulong)(uint)size);
            }
            goto LAB_00109350;
          }
          sVar4 = read(iVar2,local_1038,0x1000);
          uVar6 = (uint)sVar4;
          if (((int)uVar6 < 1) || (size < (int)(uVar7 + uVar6))) goto LAB_00109339;
          iVar3 = bcmp(local_1038,mem + uVar7,(ulong)(uVar6 & 0x7fffffff));
          uVar1 = uVar7 + uVar6;
        } while (iVar3 == 0);
        uVar5 = 0;
        do {
          if (local_1038[uVar5] != (mem + uVar7)[uVar5]) {
            uVar6 = (uint)uVar5;
            break;
          }
          uVar5 = uVar5 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar5);
        fprintf(_stderr,"Compare error at position %d\n",(ulong)(uVar6 + uVar7));
        close(iVar2);
        return 1;
      }
      __format = "failed to open %s for reading";
    }
  }
  fprintf(_stderr,__format,filename);
  return -1;
}

Assistant:

static int compareFileMem(const char *filename, const char *mem, int size) {
    int res;
    int fd;
    char bytes[4096];
    int idx = 0;
    struct stat info;

    if (update_results) {
        fd = open(filename, WR_FLAGS, 0644);
        if (fd < 0) {
	    fprintf(stderr, "failed to open %s for writing", filename);
            return(-1);
	}
        res = write(fd, mem, size);
        close(fd);
        return(res != size);
    }

    if (stat(filename, &info) < 0) {
        fprintf(stderr, "failed to stat %s\n", filename);
	return(-1);
    }
    if (info.st_size != size) {
        fprintf(stderr, "file %s is %ld bytes, result is %d bytes\n",
	        filename, (long) info.st_size, size);
        return(-1);
    }
    fd = open(filename, RD_FLAGS);
    if (fd < 0) {
	fprintf(stderr, "failed to open %s for reading", filename);
        return(-1);
    }
    while (idx < size) {
        res = read(fd, bytes, 4096);
	if (res <= 0)
	    break;
	if (res + idx > size)
	    break;
	if (memcmp(bytes, &mem[idx], res) != 0) {
	    int ix;
	    for (ix=0; ix<res; ix++)
		if (bytes[ix] != mem[idx+ix])
			break;
	    fprintf(stderr,"Compare error at position %d\n", idx+ix);
	    close(fd);
	    return(1);
	}
	idx += res;
    }
    close(fd);
    if (idx != size) {
	fprintf(stderr,"Compare error index %d, size %d\n", idx, size);
    }
    return(idx != size);
}